

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void canvas_howputnew(_glist *x,int *connectp,int *xpixp,int *ypixp,int *indexp,int *totalp)

{
  t_selection *ptVar1;
  t_gobj *ptVar2;
  int iVar3;
  t_gobj **pptVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  t_gobj *x_00;
  int iVar8;
  bool bVar9;
  int x1;
  int *local_50;
  uint *local_48;
  int y2;
  int y1;
  int x2;
  
  ptVar1 = x->gl_editor->e_selection;
  if ((ptVar1 == (t_selection *)0x0) || (ptVar1->sel_next != (_selection *)0x0)) {
    bVar9 = false;
  }
  else {
    bVar9 = sys_noautopatch == 0;
  }
  iVar3 = x->gl_zoom;
  local_48 = (uint *)connectp;
  glist_nograb(x);
  local_50 = indexp;
  if (bVar9 == false) {
    glist_getnextxy(x,xpixp,ypixp);
    *xpixp = *xpixp / x->gl_zoom + -3;
    *ypixp = *ypixp / x->gl_zoom + -3;
    glist_noselect(x);
    iVar5 = 0;
    iVar7 = 0;
  }
  else {
    ptVar2 = x->gl_editor->e_selection->sel_what;
    iVar8 = -1;
    for (pptVar4 = &x->gl_list; *pptVar4 != (t_gobj *)0x0; pptVar4 = &(*pptVar4)->g_next) {
      iVar8 = iVar8 + 1;
    }
    glist_noselect(x);
    iVar5 = iVar8 + 1;
    iVar6 = 0;
    x_00 = x->gl_list;
    while (x_00 != (t_gobj *)0x0) {
      iVar7 = iVar6;
      if ((x_00 == ptVar2) || (iVar7 = iVar8, x_00->g_next == (_gobj *)0x0)) {
        gobj_getrect(x_00,x,&x1,&y1,&x2,&y2);
        *xpixp = x1 / x->gl_zoom;
        iVar3 = (int)(((float)iVar3 * 5.5 + (float)y2) / (float)x->gl_zoom);
        goto LAB_001588a4;
      }
      iVar6 = iVar6 + 1;
      x_00 = x_00->g_next;
    }
    glist_getnextxy(x,xpixp,ypixp);
    *xpixp = *xpixp / x->gl_zoom + -3;
    iVar3 = *ypixp / x->gl_zoom + -3;
    iVar7 = 0;
LAB_001588a4:
    *ypixp = iVar3;
  }
  *local_48 = (uint)bVar9;
  *local_50 = iVar7;
  *totalp = iVar5;
  return;
}

Assistant:

static void canvas_howputnew(t_canvas *x, int *connectp, int *xpixp, int *ypixp,
    int *indexp, int *totalp)
{
    float dx = 5.5 * x->gl_zoom;
    int xpix, ypix, indx = 0, nobj = 0, n2, x1, x2, y1, y2;
    int connectme = (x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next && !sys_noautopatch);
    glist_nograb(x);
    if (connectme)
    {
        t_gobj *g, *selected = x->gl_editor->e_selection->sel_what;
            /* get number of objects */
        for (g = x->gl_list, nobj = 0; g; g = g->g_next, nobj++) ;

            /* deselect the current selection (and create pending objects) */
        glist_noselect(x);

            /* search back for 'selected' and if it isn't on the list,
                plan just to connect from the last item on the list. */
        for (g = x->gl_list, n2 = 0; g; g = g->g_next, n2++)
        {
            if (g == selected)
            {
                indx = n2;
                break;
            }
            else if (!g->g_next) {
                    /* we couldn't find the selected object any more
                     * this probably means, that it was replaced by a newly
                     * created object, which is now the last on the list.
                     */
                indx = nobj-1;
                break;
            }
        }
            /* so where do we put the new object?
               just below the one we connect from! */
        if(g) {
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            *xpixp = x1 / x->gl_zoom;
            *ypixp = (y2+dx) / x->gl_zoom;  /* 5 pixels down, rounded */
        } else {
                /* just in case */
            glist_getnextxy(x, xpixp, ypixp);
            *xpixp = *xpixp/x->gl_zoom - 3;
            *ypixp = *ypixp/x->gl_zoom - 3;
        }
    }
    else
    {
        glist_getnextxy(x, xpixp, ypixp);
        *xpixp = *xpixp/x->gl_zoom - 3;
        *ypixp = *ypixp/x->gl_zoom - 3;
        glist_noselect(x);
    }
    *connectp = connectme;
    *indexp = indx;
    *totalp = nobj;
}